

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  size_t sVar1;
  int iVar2;
  list_node *src_len;
  known_host *entry;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  size_t src_len_00;
  undefined1 *__n;
  LIBSSH2_SESSION *pLVar6;
  char *ptr;
  list_head *local_88;
  char *local_80;
  list_node *local_78;
  known_host *local_70;
  char *local_68;
  char *local_60;
  list_node *local_58;
  size_t local_50;
  libssh2_knownhost **local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = store;
  local_40 = commentlen;
  local_68 = comment;
  local_38 = keylen;
  local_80 = key;
  local_60 = key_type_name;
  local_50 = key_type_len;
  src_len = (list_node *)strlen(host);
  pLVar6 = hosts->session;
  if ((typemask & 0x3c0000U) == 0) {
    pcVar3 = "No key type set";
    iVar2 = -0x22;
LAB_00118df8:
    iVar2 = _libssh2_error(pLVar6,iVar2,pcVar3);
    return iVar2;
  }
  entry = (known_host *)_libssh2_calloc(pLVar6,0x90);
  if (entry == (known_host *)0x0) {
    pLVar6 = hosts->session;
    pcVar3 = "Unable to allocate memory for known host entry";
    iVar2 = -6;
    goto LAB_00118df8;
  }
  entry->typemask = typemask;
  if ((short)typemask == 3) {
LAB_00118d59:
    __n = (undefined1 *)((long)&src_len->next + 1);
    local_58 = src_len;
    pcVar3 = (char *)(*hosts->session->alloc)((size_t)__n,&hosts->session->abstract);
    entry->name = pcVar3;
    local_70 = entry;
    if (pcVar3 == (char *)0x0) {
      iVar2 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for host name");
      entry = local_70;
      goto LAB_00119057;
    }
    memcpy(pcVar3,host,(size_t)__n);
    lVar4 = 0x20;
    local_78 = local_58;
    entry = local_70;
  }
  else {
    if ((typemask & 0xffffU) != 2) {
      if ((typemask & 0xffffU) != 1) {
        iVar2 = _libssh2_error(hosts->session,-0x21,"Unknown host name type");
        goto LAB_00119057;
      }
      goto LAB_00118d59;
    }
    iVar2 = _libssh2_base64_decode
                      (hosts->session,(char **)&local_88,(size_t *)&local_78,host,(size_t)src_len);
    if (iVar2 != 0) goto LAB_00119057;
    entry->name = (char *)local_88;
    entry->name_len = (size_t)local_78;
    pLVar6 = hosts->session;
    src_len_00 = strlen(salt);
    iVar2 = _libssh2_base64_decode(pLVar6,(char **)&local_88,(size_t *)&local_78,salt,src_len_00);
    if (iVar2 != 0) goto LAB_00119057;
    entry->salt = (char *)local_88;
    lVar4 = 0x38;
  }
  *(list_node **)((long)&(entry->node).next + lVar4) = local_78;
  if (((uint)typemask >> 0x11 & 1) == 0) {
    sVar5 = _libssh2_base64_encode(hosts->session,local_80,local_38,(char **)&local_88);
    if (sVar5 != 0) {
      entry->key = (char *)local_88;
      goto LAB_00118f0d;
    }
    pLVar6 = hosts->session;
    pcVar3 = "Unable to allocate memory for base64-encoded key";
  }
  else {
    sVar5 = local_38;
    if (local_38 == 0) {
      sVar5 = strlen(local_80);
    }
    pcVar3 = (char *)(*hosts->session->alloc)(sVar5 + 1,&hosts->session->abstract);
    entry->key = pcVar3;
    if (pcVar3 == (char *)0x0) {
      iVar2 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for key");
      goto LAB_00119057;
    }
    memcpy(pcVar3,local_80,sVar5 + 1);
    entry->key[sVar5] = '\0';
LAB_00118f0d:
    sVar1 = local_40;
    sVar5 = local_50;
    if ((typemask & 0x3c0000U) == 0x3c0000 && local_60 != (char *)0x0) {
      pcVar3 = (char *)(*hosts->session->alloc)(local_50 + 1,&hosts->session->abstract);
      entry->key_type_name = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pLVar6 = hosts->session;
        pcVar3 = "Unable to allocate memory for key type";
        goto LAB_00119047;
      }
      memcpy(pcVar3,local_60,sVar5);
      entry->key_type_name[sVar5] = '\0';
      entry->key_type_len = sVar5;
    }
    if (local_68 == (char *)0x0) {
      entry->comment = (char *)0x0;
LAB_00118fab:
      _libssh2_list_add(&hosts->head,&entry->node);
      if (local_48 != (libssh2_knownhost **)0x0) {
        (entry->external).magic = 0xdeadcafe;
        (entry->external).node = entry;
        iVar2 = entry->typemask;
        if ((short)iVar2 == 1) {
          pcVar3 = entry->name;
        }
        else {
          pcVar3 = (char *)0x0;
        }
        (entry->external).name = pcVar3;
        (entry->external).key = entry->key;
        (entry->external).typemask = iVar2;
        *local_48 = &entry->external;
        return 0;
      }
      return 0;
    }
    pcVar3 = (char *)(*hosts->session->alloc)(sVar1 + 1,&hosts->session->abstract);
    entry->comment = pcVar3;
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,local_68,sVar1 + 1);
      entry->comment[sVar1] = '\0';
      entry->comment_len = sVar1;
      goto LAB_00118fab;
    }
    pLVar6 = hosts->session;
    pcVar3 = "Unable to allocate memory for comment";
  }
LAB_00119047:
  iVar2 = _libssh2_error(pLVar6,-6,pcVar3);
LAB_00119057:
  free_host(hosts->session,entry);
  return iVar2;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;
        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}